

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.cpp
# Opt level: O2

void real_test(void)

{
  return;
}

Assistant:

void real_test()
{
  // test single cases
  assert( static_cast<float>(single_zero()) == 0.f);
  assert( static_cast<float>(single_one())  == 1.f);
  assert( is_nan(static_cast<float>(single_nan())) );

  // test double
  assert( static_cast<double>(double_zero()) == 0.);
  assert( static_cast<double>(double_one())  == 1.);
  assert( is_nan(static_cast<double>(double_nan())) );
}